

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O0

int nn_xsurveyor_recv(nn_sockbase *self,nn_msg *msg)

{
  size_t sVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  nn_sockbase *local_38;
  nn_xsurveyor *xsurveyor;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  self_local._4_4_ = nn_fq_recv((nn_fq *)&local_38[2].sock,msg,(nn_pipe **)0x0);
  if (-1 < (int)self_local._4_4_) {
    if ((self_local._4_4_ & 2) == 0) {
      sVar1 = nn_chunkref_size(&msg->body);
      if (sVar1 < 4) {
        nn_msg_term(msg);
        return -0xb;
      }
      sVar1 = nn_chunkref_size(&msg->sphdr);
      if (sVar1 != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/xsurveyor.c"
                ,0xb2);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_chunkref_term(&msg->sphdr);
      nn_chunkref_init(&msg->sphdr,4);
      puVar2 = (undefined4 *)nn_chunkref_data(&msg->sphdr);
      puVar3 = (undefined4 *)nn_chunkref_data(&msg->body);
      *puVar2 = *puVar3;
      nn_chunkref_trim(&msg->body,4);
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_xsurveyor_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xsurveyor *xsurveyor;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    rc = nn_fq_recv (&xsurveyor->inpipes, msg, NULL);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {
        if (nn_slow (nn_chunkref_size (&msg->body) < sizeof (uint32_t))) {
            nn_msg_term (msg);
            return -EAGAIN;
        }
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), nn_chunkref_data (&msg->body),
           sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, sizeof (uint32_t));
    }

    return 0;
}